

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void parsePrecedence(Precedence precedence)

{
  bool bVar1;
  _Bool _Var2;
  ParseRule *pPVar3;
  Precedence in_EDI;
  ParseFn infixRule;
  _Bool canAssign;
  ParseFn prefixRule;
  
  advance();
  pPVar3 = getRule(parser.previous.type);
  if (pPVar3->prefix == (ParseFn)0x0) {
    error((char *)0x106884);
  }
  else {
    bVar1 = in_EDI < PREC_OR;
    (*pPVar3->prefix)(bVar1);
    while (pPVar3 = getRule(parser.current.type), in_EDI <= pPVar3->precedence) {
      advance();
      pPVar3 = getRule(parser.previous.type);
      (*pPVar3->infix)(bVar1);
    }
    if ((bVar1) && (_Var2 = match(0x106904), _Var2)) {
      error((char *)0x106916);
      expression();
    }
  }
  return;
}

Assistant:

static void parsePrecedence(Precedence precedence) {
    advance();
    ParseFn prefixRule = getRule(parser.previous.type)->prefix;
    if (prefixRule == NULL) {
        error("Expect expression.");
        return;
    }

    bool canAssign = precedence <= PREC_ASSIGNMENT;
    prefixRule(canAssign);

    while (precedence <= getRule(parser.current.type)->precedence) {
        advance();
        ParseFn infixRule = getRule(parser.previous.type)->infix;
        infixRule(canAssign);
    }

    if (canAssign && match(TOKEN_EQUAL)) {
        error("Invalid assignment target.");
        expression();
    }
}